

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionExecutionStateMachine.cpp
# Opt level: O1

void __thiscall
Js::FunctionExecutionStateMachine::ResetSimpleJitLimit(FunctionExecutionStateMachine *this)

{
  code *pcVar1;
  ushort uVar2;
  bool bVar3;
  undefined4 *puVar4;
  
  if (this->initializedExecutionModeAndLimits == false) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionExecutionStateMachine.cpp"
                                ,0x2c9,"(initializedExecutionModeAndLimits)",
                                "initializedExecutionModeAndLimits");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  VerifyExecutionMode(this,SimpleJit);
  this->executionState = SimpleJit;
  if ((uint)this->simpleJitLimit < (DAT_015bbe1c & 0xff)) {
    uVar2 = (ushort)DAT_015bbe1c;
    this->fullJitThreshold =
         this->fullJitThreshold + ((short)(DAT_015bbe1c & 0xff) - this->simpleJitLimit);
    this->simpleJitLimit = uVar2 & 0xff;
  }
  this->interpretedCount = 0;
  return;
}

Assistant:

void FunctionExecutionStateMachine::ResetSimpleJitLimit()
    {
        Assert(initializedExecutionModeAndLimits);

        SetExecutionState(ExecutionState::SimpleJit);

        const uint16 simpleJitNewLimit = static_cast<uint8>(Configuration::Global.flags.SimpleJitLimit);
        if (simpleJitLimit < simpleJitNewLimit)
        {
            fullJitThreshold += simpleJitNewLimit - simpleJitLimit;
            simpleJitLimit = simpleJitNewLimit;
        }

        SetInterpretedCount(0);
    }